

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.cpp
# Opt level: O0

int stbi_is_hdr_from_memory(stbi_uc *buffer,int len)

{
  int iVar1;
  int in_ESI;
  stbi_uc *in_RDI;
  stbi__context s;
  stbi__context *in_stack_ffffffffffffff20;
  
  stbi__start_mem((stbi__context *)&stack0xffffffffffffff18,in_RDI,in_ESI);
  iVar1 = stbi__hdr_test(in_stack_ffffffffffffff20);
  return iVar1;
}

Assistant:

STBIDEF int stbi_is_hdr_from_memory(stbi_uc const *buffer, int len)
{
   #ifndef STBI_NO_HDR
   stbi__context s;
   stbi__start_mem(&s,buffer,len);
   return stbi__hdr_test(&s);
   #else
   STBI_NOTUSED(buffer);
   STBI_NOTUSED(len);
   return 0;
   #endif
}